

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall Catch::JunitReporter::writeAssertion(JunitReporter *this,AssertionStats *stats)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  OfType OVar3;
  ostream *os;
  pointer pMVar4;
  StringRef attribute;
  StringRef text;
  bool bVar5;
  Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams> *pSVar6;
  size_t sVar7;
  char *pcVar8;
  XmlWriter *this_00;
  MessageInfo *msg;
  pointer pMVar9;
  StringRef name;
  StringRef name_00;
  string elementName;
  ReusableStringStream rss;
  ScopedElement e;
  char local_d9;
  Column local_d8;
  undefined1 *local_98;
  string local_90;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  ReusableStringStream local_50;
  
  OVar3 = (stats->assertionResult).m_resultData.resultType;
  if (((OVar3 & FailureBit) == Ok) ||
     (((stats->assertionResult).m_info.resultDisposition & SuppressFail) != 0)) {
    if (OVar3 != ExplicitSkip) {
      return;
    }
    local_98 = &local_60;
    local_68 = 0;
    local_60 = 0;
    local_70 = local_98;
    std::__cxx11::string::_M_replace((ulong)&local_70,0,(char *)0x0,0x180bba);
    goto LAB_001593c6;
  }
  local_98 = &local_60;
  local_68 = 0;
  local_60 = 0;
  pcVar8 = "failure";
  local_70 = local_98;
  if (OVar3 < Exception) {
    if (1 < (uint)(OVar3 + ~FailureBit)) {
      if ((OVar3 != Unknown) && (OVar3 != FailureBit)) goto LAB_001593c6;
LAB_0015938e:
      pcVar8 = "internalError";
    }
  }
  else {
    if (OVar3 < DidntThrowException) {
      if (OVar3 == Exception) goto LAB_0015938e;
      if (OVar3 != ThrewException) goto LAB_001593c6;
    }
    else {
      if (OVar3 == DidntThrowException) goto LAB_001593b8;
      if (OVar3 != FatalErrorCondition) goto LAB_001593c6;
    }
    pcVar8 = "error";
  }
LAB_001593b8:
  std::__cxx11::string::_M_replace((ulong)&local_70,0,(char *)0x0,(ulong)pcVar8);
LAB_001593c6:
  this_00 = &this->xml;
  XmlWriter::scopedElement
            ((XmlWriter *)&stack0xffffffffffffffc0,(string *)this_00,(XmlFormatting)&local_70);
  AssertionResult::getExpression_abi_cxx11_((string *)&local_d8,&stats->assertionResult);
  attribute.m_start._1_7_ = local_d8.m_string.m_string._M_dataplus._M_p._1_7_;
  attribute.m_start._0_1_ = local_d8.m_string.m_string._M_dataplus._M_p._0_1_;
  attribute.m_size = local_d8.m_string.m_string._M_string_length;
  name.m_size = 7;
  name.m_start = "message";
  XmlWriter::writeAttribute(this_00,name,attribute);
  paVar1 = &local_d8.m_string.m_string.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_d8.m_string.m_string._M_dataplus._M_p._1_7_,
                  local_d8.m_string.m_string._M_dataplus._M_p._0_1_) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT71(local_d8.m_string.m_string._M_dataplus._M_p._1_7_,
                             local_d8.m_string.m_string._M_dataplus._M_p._0_1_),
                    local_d8.m_string.m_string.field_2._M_allocated_capacity + 1);
  }
  name_00.m_size = 4;
  name_00.m_start = "type";
  XmlWriter::writeAttribute(this_00,name_00,(stats->assertionResult).m_info.macroName);
  pSVar6 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getInternal
                     ();
  sVar7 = StringStreams::add(&pSVar6->super_StringStreams);
  local_50.m_index = sVar7;
  pSVar6 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getInternal
                     ();
  os = (ostream *)
       (pSVar6->super_StringStreams).m_streams.
       super__Vector_base<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<Catch::Detail::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[sVar7].m_ptr;
  local_50.m_oss = os;
  if ((stats->assertionResult).m_resultData.resultType == ExplicitSkip) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"SKIPPED\n",8);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(os,"FAILED",6);
    std::__ostream_insert<char,std::char_traits<char>>(os,":\n",2);
    if ((stats->assertionResult).m_info.capturedExpression.m_size != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(os,"  ",2);
      AssertionResult::getExpressionInMacro_abi_cxx11_((string *)&local_d8,&stats->assertionResult);
      std::__ostream_insert<char,std::char_traits<char>>
                (os,(char *)CONCAT71(local_d8.m_string.m_string._M_dataplus._M_p._1_7_,
                                     local_d8.m_string.m_string._M_dataplus._M_p._0_1_),
                 local_d8.m_string.m_string._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_d8.m_string.m_string._M_dataplus._M_p._1_7_,
                      local_d8.m_string.m_string._M_dataplus._M_p._0_1_) != paVar1) {
        operator_delete((undefined1 *)
                        CONCAT71(local_d8.m_string.m_string._M_dataplus._M_p._1_7_,
                                 local_d8.m_string.m_string._M_dataplus._M_p._0_1_),
                        local_d8.m_string.m_string.field_2._M_allocated_capacity + 1);
      }
      local_d8.m_string.m_string._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_d8,1);
    }
    bVar5 = AssertionResult::hasExpandedExpression(&stats->assertionResult);
    if (bVar5) {
      std::__ostream_insert<char,std::char_traits<char>>(os,"with expansion:\n",0x10);
      AssertionResult::getExpandedExpression_abi_cxx11_(&local_90,&stats->assertionResult);
      local_d8.m_string.m_string._M_dataplus._M_p._0_1_ = SUB81(paVar1,0);
      local_d8.m_string.m_string._M_dataplus._M_p._1_7_ = (undefined7)((ulong)paVar1 >> 8);
      paVar2 = &local_90.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p == paVar2) {
        local_d8.m_string.m_string.field_2._8_8_ = local_90.field_2._8_8_;
      }
      else {
        local_d8.m_string.m_string._M_dataplus._M_p._0_1_ = SUB81(local_90._M_dataplus._M_p,0);
        local_d8.m_string.m_string._M_dataplus._M_p._1_7_ =
             (undefined7)((ulong)local_90._M_dataplus._M_p >> 8);
      }
      local_d8.m_string.m_string.field_2._M_allocated_capacity._1_7_ =
           local_90.field_2._M_allocated_capacity._1_7_;
      local_d8.m_string.m_string.field_2._M_local_buf[0] = local_90.field_2._M_local_buf[0];
      local_d8.m_string.m_string._M_string_length = local_90._M_string_length;
      local_90._M_string_length = 0;
      local_90.field_2._M_local_buf[0] = '\0';
      local_d8.m_string.m_size = 0;
      local_90._M_dataplus._M_p = (pointer)paVar2;
      TextFlow::AnsiSkippingString::preprocessString(&local_d8.m_string);
      local_d8.m_width = 0x4f;
      local_d8.m_initialIndent = 0xffffffffffffffff;
      local_d8.m_indent = 2;
      TextFlow::operator<<(os,&local_d8);
      local_d9 = '\n';
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_d9,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_d8.m_string.m_string._M_dataplus._M_p._1_7_,
                      local_d8.m_string.m_string._M_dataplus._M_p._0_1_) != paVar1) {
        operator_delete((undefined1 *)
                        CONCAT71(local_d8.m_string.m_string._M_dataplus._M_p._1_7_,
                                 local_d8.m_string.m_string._M_dataplus._M_p._0_1_),
                        local_d8.m_string.m_string.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != paVar2) {
        operator_delete(local_90._M_dataplus._M_p,
                        CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                                 local_90.field_2._M_local_buf[0]) + 1);
      }
    }
  }
  if ((stats->assertionResult).m_resultData.message._M_string_length != 0) {
    std::ostream::write((char *)os,
                        (long)(stats->assertionResult).m_resultData.message._M_dataplus._M_p);
    local_d8.m_string.m_string._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_d8,1);
  }
  pMVar9 = (stats->infoMessages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  pMVar4 = (stats->infoMessages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pMVar9 != pMVar4) {
    do {
      if (pMVar9->type == Info) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (os,(pMVar9->message)._M_dataplus._M_p,(pMVar9->message)._M_string_length);
        local_d8.m_string.m_string._M_dataplus._M_p._0_1_ = 10;
        std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_d8,1);
      }
      pMVar9 = pMVar9 + 1;
    } while (pMVar9 != pMVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"at ",3);
  pcVar8 = (stats->assertionResult).m_info.lineInfo.file;
  local_d8.m_string.m_string._M_string_length = (stats->assertionResult).m_info.lineInfo.line;
  local_d8.m_string.m_string._M_dataplus._M_p._0_1_ = SUB81(pcVar8,0);
  local_d8.m_string.m_string._M_dataplus._M_p._1_7_ = (undefined7)((ulong)pcVar8 >> 8);
  operator<<(os,(SourceLineInfo *)&local_d8);
  std::__cxx11::stringbuf::str();
  text.m_start._1_7_ = local_d8.m_string.m_string._M_dataplus._M_p._1_7_;
  text.m_start._0_1_ = local_d8.m_string.m_string._M_dataplus._M_p._0_1_;
  text.m_size = local_d8.m_string.m_string._M_string_length;
  XmlWriter::writeText(this_00,text,Newline);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_d8.m_string.m_string._M_dataplus._M_p._1_7_,
                  local_d8.m_string.m_string._M_dataplus._M_p._0_1_) !=
      &local_d8.m_string.m_string.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_d8.m_string.m_string._M_dataplus._M_p._1_7_,
                             local_d8.m_string.m_string._M_dataplus._M_p._0_1_),
                    local_d8.m_string.m_string.field_2._M_allocated_capacity + 1);
  }
  ReusableStringStream::~ReusableStringStream(&local_50);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)&stack0xffffffffffffffc0);
  if (local_70 != local_98) {
    operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
  }
  return;
}

Assistant:

void JunitReporter::writeAssertion( AssertionStats const& stats ) {
        AssertionResult const& result = stats.assertionResult;
        if ( !result.isOk() ||
             result.getResultType() == ResultWas::ExplicitSkip ) {
            std::string elementName;
            switch( result.getResultType() ) {
                case ResultWas::ThrewException:
                case ResultWas::FatalErrorCondition:
                    elementName = "error";
                    break;
                case ResultWas::ExplicitFailure:
                case ResultWas::ExpressionFailed:
                case ResultWas::DidntThrowException:
                    elementName = "failure";
                    break;
                case ResultWas::ExplicitSkip:
                    elementName = "skipped";
                    break;
                // We should never see these here:
                case ResultWas::Info:
                case ResultWas::Warning:
                case ResultWas::Ok:
                case ResultWas::Unknown:
                case ResultWas::FailureBit:
                case ResultWas::Exception:
                    elementName = "internalError";
                    break;
            }

            XmlWriter::ScopedElement e = xml.scopedElement( elementName );

            xml.writeAttribute( "message"_sr, result.getExpression() );
            xml.writeAttribute( "type"_sr, result.getTestMacroName() );

            ReusableStringStream rss;
            if ( result.getResultType() == ResultWas::ExplicitSkip ) {
                rss << "SKIPPED\n";
            } else {
                rss << "FAILED" << ":\n";
                if (result.hasExpression()) {
                    rss << "  ";
                    rss << result.getExpressionInMacro();
                    rss << '\n';
                }
                if (result.hasExpandedExpression()) {
                    rss << "with expansion:\n";
                    rss << TextFlow::Column(result.getExpandedExpression()).indent(2) << '\n';
                }
            }

            if( result.hasMessage() )
                rss << result.getMessage() << '\n';
            for( auto const& msg : stats.infoMessages )
                if( msg.type == ResultWas::Info )
                    rss << msg.message << '\n';

            rss << "at " << result.getSourceInfo();
            xml.writeText( rss.str(), XmlFormatting::Newline );
        }
    }